

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cStencilTexturingTests.cpp
# Opt level: O0

GLuint gl4cts::StencilTexturing::Utils::createAndBuildProgram
                 (Context *context,GLchar *cs_code,GLchar *fs_code,GLchar *gs_code,GLchar *tcs_code,
                 GLchar *tes_code,GLchar *vs_code)

{
  code *pcVar1;
  undefined4 uVar2;
  int iVar3;
  GLuint GVar4;
  deUint32 dVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  TestContext *pTVar8;
  TestLog *pTVar9;
  MessageBuilder *pMVar10;
  undefined8 uVar11;
  GLuint j_2;
  exception *exc;
  undefined1 local_280 [8];
  string message;
  GLint length;
  GLuint j_1;
  GLuint i_2;
  GLuint j;
  uint local_d0;
  GLuint i_1;
  uint local_c0;
  int local_bc;
  GLuint i;
  GLint status;
  GLenum shader_types [6];
  GLchar *local_98;
  GLchar *shader_sources [6];
  GLuint shader_ids [6];
  GLuint id;
  Functions *gl;
  GLchar *tes_code_local;
  GLchar *tcs_code_local;
  GLchar *gs_code_local;
  GLchar *fs_code_local;
  GLchar *cs_code_local;
  Context *context_local;
  long lVar7;
  
  pRVar6 = deqp::Context::getRenderContext(context);
  iVar3 = (*pRVar6->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar3);
  memset(shader_sources + 5,0,0x18);
  shader_sources[0] = fs_code;
  shader_sources[1] = gs_code;
  shader_sources[2] = tcs_code;
  shader_sources[3] = tes_code;
  shader_sources[4] = vs_code;
  _i = 0x8b30000091b9;
  shader_types[0] = 0x8dd9;
  shader_types[1] = 0x8e88;
  shader_types[2] = 0x8e87;
  shader_types[3] = 0x8b31;
  local_bc = 0;
  for (local_c0 = 0; local_c0 < 6; local_c0 = local_c0 + 1) {
    if (shader_sources[(ulong)local_c0 - 1] != (GLchar *)0x0) {
      GVar4 = createAndCompileShader(context,(&i)[local_c0],shader_sources[(ulong)local_c0 - 1]);
      shader_ids[(ulong)local_c0 - 2] = GVar4;
    }
  }
  local_d0 = 0;
  while( true ) {
    if (5 < local_d0) {
      context_local._4_4_ = (**(code **)(lVar7 + 0x3c8))();
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"CreateProgram",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                      ,0x7f);
      for (length = 0; (uint)length < 6; length = length + 1) {
        if (shader_ids[(ulong)(uint)length - 2] != 0) {
          (**(code **)(lVar7 + 0x10))(context_local._4_4_,shader_ids[(ulong)(uint)length - 2]);
          dVar5 = (**(code **)(lVar7 + 0x800))();
          glu::checkError(dVar5,"AttachShader",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                          ,0x87);
        }
      }
      (**(code **)(lVar7 + 0xce8))(context_local._4_4_);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"LinkProgram",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                      ,0x8d);
      for (message.field_2._12_4_ = 0; (uint)message.field_2._12_4_ < 6;
          message.field_2._12_4_ = message.field_2._12_4_ + 1) {
        deleteShader(context,shader_ids[(ulong)(uint)message.field_2._12_4_ - 2]);
      }
      (**(code **)(lVar7 + 0x9d8))(context_local._4_4_,0x8b82,&local_bc);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"GetProgramiv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                      ,0x97);
      if (local_bc != 1) {
        message.field_2._8_4_ = 0;
        std::__cxx11::string::string((string *)local_280);
        (**(code **)(lVar7 + 0x9d8))
                  (context_local._4_4_,0x8b84,(undefined1 *)((long)&message.field_2 + 8));
        dVar5 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar5,"GetProgramiv",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                        ,0xa1);
        std::__cxx11::string::resize((ulong)local_280,(char)message.field_2._8_4_);
        uVar2 = message.field_2._8_4_;
        pcVar1 = *(code **)(lVar7 + 0x988);
        uVar11 = std::__cxx11::string::operator[]((ulong)local_280);
        (*pcVar1)(context_local._4_4_,uVar2,0,uVar11);
        dVar5 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar5,"GetProgramInfoLog",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                        ,0xa7);
        pTVar8 = deqp::Context::getTestContext(context);
        pTVar9 = tcu::TestContext::getLog(pTVar8);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)&exc,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar10 = tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)&exc,(char (*) [25])"Program linking failed: ");
        pMVar10 = tcu::MessageBuilder::operator<<
                            (pMVar10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_280);
        tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&exc);
        deleteProgram(context,context_local._4_4_);
        context_local._4_4_ = 0;
        std::__cxx11::string::~string((string *)local_280);
      }
      return context_local._4_4_;
    }
    if ((shader_sources[(ulong)local_d0 - 1] != (GLchar *)0x0) &&
       (shader_ids[(ulong)local_d0 - 2] == 0)) break;
    local_d0 = local_d0 + 1;
  }
  pTVar8 = deqp::Context::getTestContext(context);
  pTVar9 = tcu::TestContext::getLog(pTVar8);
  tcu::TestLog::operator<<
            ((MessageBuilder *)&i_2,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar10 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&i_2,
                       (char (*) [52])"Failed to build program due to compilation problems");
  tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&i_2);
  for (j_1 = 0; j_1 < 6; j_1 = j_1 + 1) {
    deleteShader(context,shader_ids[(ulong)j_1 - 2]);
  }
  return 0;
}

Assistant:

GLuint Utils::createAndBuildProgram(deqp::Context& context, const GLchar* cs_code, const GLchar* fs_code,
									const GLchar* gs_code, const GLchar* tcs_code, const GLchar* tes_code,
									const GLchar* vs_code)
{
#define N_SHADER_STAGES 6

	const Functions& gl							 = context.getRenderContext().getFunctions();
	GLuint			 id							 = 0;
	GLuint			 shader_ids[N_SHADER_STAGES] = { 0 };

	const GLchar* shader_sources[N_SHADER_STAGES] = { cs_code, fs_code, gs_code, tcs_code, tes_code, vs_code };

	const GLenum shader_types[N_SHADER_STAGES] = { GL_COMPUTE_SHADER,		  GL_FRAGMENT_SHADER,
												   GL_GEOMETRY_SHADER,		  GL_TESS_CONTROL_SHADER,
												   GL_TESS_EVALUATION_SHADER, GL_VERTEX_SHADER };
	GLint status = GL_FALSE;

	/* Compile all shaders */
	try
	{
		for (GLuint i = 0; i < N_SHADER_STAGES; ++i)
		{
			if (0 != shader_sources[i])
			{
				shader_ids[i] = createAndCompileShader(context, shader_types[i], shader_sources[i]);
			}
		}

		/* Check compilation */
		for (GLuint i = 0; i < N_SHADER_STAGES; ++i)
		{
			if ((0 != shader_sources[i]) && (0 == shader_ids[i]))
			{
				context.getTestContext().getLog() << tcu::TestLog::Message
												  << "Failed to build program due to compilation problems"
												  << tcu::TestLog::EndMessage;

				/* Delete shaders */
				for (GLuint j = 0; j < N_SHADER_STAGES; ++j)
				{
					deleteShader(context, shader_ids[j]);
				}

				/* Done */
				return 0;
			}
		}

		/* Create program */
		id = gl.createProgram();
		GLU_EXPECT_NO_ERROR(gl.getError(), "CreateProgram");

		/* Attach shaders */
		for (GLuint i = 0; i < N_SHADER_STAGES; ++i)
		{
			if (0 != shader_ids[i])
			{
				gl.attachShader(id, shader_ids[i]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "AttachShader");
			}
		}

		/* Link program */
		gl.linkProgram(id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "LinkProgram");

		/* Clean shaders */
		for (GLuint j = 0; j < N_SHADER_STAGES; ++j)
		{
			deleteShader(context, shader_ids[j]);
		}

		/* Get link status */
		gl.getProgramiv(id, GL_LINK_STATUS, &status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramiv");

		/* Log link error */
		if (GL_TRUE != status)
		{
			glw::GLint  length = 0;
			std::string message;

			/* Get error log length */
			gl.getProgramiv(id, GL_INFO_LOG_LENGTH, &length);
			GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramiv");

			message.resize(length, 0);

			/* Get error log */
			gl.getProgramInfoLog(id, length, 0, &message[0]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramInfoLog");

			context.getTestContext().getLog() << tcu::TestLog::Message << "Program linking failed: " << message
											  << tcu::TestLog::EndMessage;

			/* Clean program */
			deleteProgram(context, id);

			/* Done */
			return 0;
		}
	}
	catch (std::exception& exc)
	{
		/* Delete shaders */
		for (GLuint j = 0; j < N_SHADER_STAGES; ++j)
		{
			deleteShader(context, shader_ids[j]);
		}

		throw exc;
	}

	return id;
}